

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O3

MovInst __thiscall mocker::detail::MoveInfo::popWorklist(MoveInfo *this)

{
  size_type sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  _Node_iterator_base<std::shared_ptr<mocker::nasm::Mov>,_true> __it;
  MovInst MVar2;
  
  __it._M_cur = *(__node_type **)(in_RSI + 0xf0);
  (this->active)._M_h._M_buckets =
       (__buckets_ptr)
       ((__it._M_cur)->super__Hash_node_value<std::shared_ptr<mocker::nasm::Mov>,_true>).
       super__Hash_node_value_base<std::shared_ptr<mocker::nasm::Mov>_>._M_storage._M_storage.
       __align;
  sVar1 = *(size_type *)
           ((long)&((__it._M_cur)->super__Hash_node_value<std::shared_ptr<mocker::nasm::Mov>,_true>)
                   .super__Hash_node_value_base<std::shared_ptr<mocker::nasm::Mov>_>._M_storage.
                   _M_storage + 8);
  (this->active)._M_h._M_bucket_count = sVar1;
  if (sVar1 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
      UNLOCK();
      __it._M_cur = *(__node_type **)(in_RSI + 0xf0);
    }
    else {
      *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
    }
  }
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::erase((_Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)(in_RSI + 0xe0),(const_iterator)__it._M_cur);
  MVar2.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar2.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MovInst)MVar2.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MovInst MoveInfo::popWorklist() {
  auto res = *worklist.begin();
  worklist.erase(worklist.begin());
  return res;
}